

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

int reserve_fields(flatcc_builder_t *B,int count)

{
  int iVar1;
  flatbuffers_voffset_t *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(B->frame->container).table.vs_end;
  uVar4 = (ulong)(B->frame->container).table.id_end;
  uVar3 = uVar5 + ((long)count + uVar4) * 2 + 4;
  if (B->buffers[0].iov_len < uVar3) {
    iVar1 = (*B->alloc)(B->alloc_context,B->buffers,uVar3,1,0);
    if (iVar1 != 0) goto LAB_00105030;
  }
  pfVar2 = (flatbuffers_voffset_t *)(uVar5 + uVar4 * 2 + (long)B->buffers[0].iov_base);
  B->vs = pfVar2;
  if (pfVar2 == (flatbuffers_voffset_t *)0x0) {
    iVar1 = -1;
  }
  else {
    B->vs = pfVar2 + 2;
    uVar4 = (ulong)(B->frame->container).table.pl_end;
    uVar3 = uVar4 + (long)count * 2 + 1;
    if (B->buffers[3].iov_len < uVar3) {
      iVar1 = (*B->alloc)(B->alloc_context,B->buffers + 3,uVar3,0,3);
      if (iVar1 != 0) {
LAB_00105030:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                      ,0x13c,"void *reserve_buffer(flatcc_builder_t *, int, size_t, size_t, int)");
      }
    }
    pfVar2 = (flatbuffers_voffset_t *)(uVar4 + (long)B->buffers[3].iov_base);
    B->pl = pfVar2;
    iVar1 = -(uint)(pfVar2 == (flatbuffers_voffset_t *)0x0);
  }
  return iVar1;
}

Assistant:

static inline int reserve_fields(flatcc_builder_t *B, int count)
{
    size_t used, need;

    /* Provide faster stack operations for common table operations. */
    used = frame(container.table.vs_end) + frame(container.table.id_end) * sizeof(voffset_t);
    need = (size_t)(count + 2) * sizeof(voffset_t);
    if (!(B->vs = reserve_buffer(B, flatcc_builder_alloc_vs, used, need, 1))) {
        return -1;
    }
    /* Move past header for convenience. */
    B->vs += 2;
    used = frame(container.table.pl_end);
    /* Add one to handle special case of first table being empty. */
    need = (size_t)count * sizeof(*(B->pl)) + 1;
    if (!(B->pl = reserve_buffer(B, flatcc_builder_alloc_pl, used, need, 0))) {
        return -1;
    }
    return 0;
}